

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O1

exr_result_t exr_attr_list_compute_size(exr_context_t ctxt,exr_attribute_list_t *list,uint64_t *out)

{
  exr_attribute_t *peVar1;
  exr_attr_opaquedata_t *u;
  bool bVar2;
  int iVar3;
  exr_result_t eVar4;
  long lVar5;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE;
  long lVar6;
  char *pcVar7;
  uint64_t uVar8;
  exr_result_t in_R10D;
  long lVar9;
  bool bVar10;
  int32_t sz;
  int32_t local_34;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (list == (exr_attribute_list_t *)0x0) {
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar7 = "Missing list to compute size";
  }
  else {
    if (out != (uint64_t *)0x0) {
      *out = 0;
      bVar2 = 0 < list->num_attributes;
      if (list->num_attributes < 1) {
        uVar8 = 0;
        eVar4 = 0;
      }
      else {
        lVar9 = 0;
        eVar4 = 0;
        uVar8 = 0;
        do {
          peVar1 = list->entries[lVar9];
          lVar5 = peVar1->name_length + uVar8;
          uVar8 = (ulong)peVar1->type_name_length + lVar5 + 6;
          if (0x1d < peVar1->type - EXR_ATTR_BOX2I) {
            bVar10 = false;
            in_R10D = (*ctxt->print_error)
                                (ctxt,3,
                                 "Invalid / unhandled type \'%s\' for attribute \'%s\', unable to compute size"
                                 ,peVar1->type_name,peVar1->name);
            goto LAB_0011f20f;
          }
          lVar5 = lVar5 + (ulong)peVar1->type_name_length;
          switch(peVar1->type) {
          case EXR_ATTR_BOX2I:
          case EXR_ATTR_BOX2F:
          case EXR_ATTR_V2D:
            uVar8 = lVar5 + 0x16;
            break;
          case EXR_ATTR_CHLIST:
            lVar5 = (long)((peVar1->field_6).chlist)->num_channels;
            bVar10 = true;
            if (0 < lVar5) {
              lVar6 = 0;
              do {
                uVar8 = uVar8 + (long)*(int *)(((peVar1->field_6).chlist)->entries->reserved +
                                              lVar6 + -0x15) + 0x11;
                lVar6 = lVar6 + 0x20;
              } while (lVar5 * 0x20 != lVar6);
            }
            goto LAB_0011f20f;
          case EXR_ATTR_CHROMATICITIES:
            uVar8 = lVar5 + 0x26;
            break;
          case EXR_ATTR_COMPRESSION:
          case EXR_ATTR_ENVMAP:
          case EXR_ATTR_LINEORDER:
          case EXR_ATTR_DEEP_IMAGE_STATE:
            uVar8 = lVar5 + 7;
            break;
          default:
            uVar8 = lVar5 + 0xe;
            break;
          case EXR_ATTR_FLOAT:
          case EXR_ATTR_INT:
            uVar8 = lVar5 + 10;
            break;
          case EXR_ATTR_FLOAT_VECTOR:
            lVar5 = (long)(((peVar1->field_6).box2i)->min).x;
            goto LAB_0011f1f6;
          case EXR_ATTR_KEYCODE:
            uVar8 = lVar5 + 0x22;
            break;
          case EXR_ATTR_M33F:
            uVar8 = lVar5 + 0x2a;
            break;
          case EXR_ATTR_M33D:
            uVar8 = lVar5 + 0x4e;
            break;
          case EXR_ATTR_M44F:
            uVar8 = lVar5 + 0x46;
            break;
          case EXR_ATTR_M44D:
            uVar8 = lVar5 + 0x86;
            break;
          case EXR_ATTR_PREVIEW:
            lVar5 = (ulong)((peVar1->field_6).preview)->height *
                    (ulong)((peVar1->field_6).preview)->width;
LAB_0011f1f6:
            uVar8 = uVar8 + lVar5 * 4;
            goto LAB_0011f241;
          case EXR_ATTR_STRING:
            iVar3 = (((peVar1->field_6).box2i)->min).x;
LAB_0011f23e:
            uVar8 = uVar8 + (long)iVar3;
            goto LAB_0011f241;
          case EXR_ATTR_STRING_VECTOR:
            lVar5 = (long)((peVar1->field_6).chlist)->num_channels;
            bVar10 = true;
            if (0 < lVar5) {
              lVar6 = 0;
              do {
                uVar8 = uVar8 + (long)*(int *)(((peVar1->field_6).chlist)->entries->reserved +
                                              lVar6 + -0x15) + 4;
                lVar6 = lVar6 + 0x10;
              } while (lVar5 * 0x10 != lVar6);
            }
            goto LAB_0011f20f;
          case EXR_ATTR_TILEDESC:
            uVar8 = lVar5 + 0xf;
            break;
          case EXR_ATTR_V3I:
          case EXR_ATTR_V3F:
            uVar8 = lVar5 + 0x12;
            break;
          case EXR_ATTR_V3D:
            uVar8 = lVar5 + 0x1e;
            break;
          case EXR_ATTR_OPAQUE:
            u = (peVar1->field_6).opaque;
            if (u->packed_data != (void *)0x0) {
              iVar3 = u->size;
              goto LAB_0011f23e;
            }
            if (u->unpacked_data != (void *)0x0) {
              local_34 = 0;
              eVar4 = exr_attr_opaquedata_pack(ctxt,u,&local_34,(void **)0x0);
              bVar10 = eVar4 == 0;
              iVar3 = 0;
              if (bVar10) {
                iVar3 = local_34;
              }
              if (!bVar10) {
                in_R10D = eVar4;
              }
              uVar8 = uVar8 + (long)iVar3;
              goto LAB_0011f20f;
            }
LAB_0011f241:
            bVar10 = true;
            goto LAB_0011f20f;
          }
          bVar10 = true;
LAB_0011f20f:
          if (!bVar10) break;
          lVar9 = lVar9 + 1;
          bVar2 = lVar9 < list->num_attributes;
        } while (lVar9 < list->num_attributes);
      }
      if (bVar2) {
        return in_R10D;
      }
      *out = uVar8;
      return eVar4;
    }
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar7 = "Expected output pointer";
  }
  eVar4 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar7);
  return eVar4;
}

Assistant:

exr_result_t
exr_attr_list_compute_size (
    exr_context_t ctxt, exr_attribute_list_t* list, uint64_t* out)
{
    uint64_t     retval = 0;
    exr_result_t rv     = EXR_ERR_SUCCESS;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!list)
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Missing list to compute size");

    if (!out)
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Expected output pointer");

    *out = 0;
    for (int i = 0; i < list->num_attributes; ++i)
    {
        const exr_attribute_t* cur = list->entries[i];
        retval += (size_t) cur->name_length + 1;
        retval += (size_t) cur->type_name_length + 1;
        retval += sizeof (int32_t);
        switch (cur->type)
        {
            case EXR_ATTR_BOX2I: retval += sizeof (*(cur->box2i)); break;
            case EXR_ATTR_BOX2F: retval += sizeof (*(cur->box2f)); break;
            case EXR_ATTR_CHLIST:
                for (int c = 0; c < cur->chlist->num_channels; ++c)
                {
                    retval += (size_t) cur->chlist->entries[c].name.length + 1;
                    retval += sizeof (int32_t) * 4;
                }
                break;
            case EXR_ATTR_CHROMATICITIES:
                retval += sizeof (*(cur->chromaticities));
                break;
            case EXR_ATTR_COMPRESSION:
            case EXR_ATTR_ENVMAP:
            case EXR_ATTR_LINEORDER: retval += sizeof (uint8_t); break;
            case EXR_ATTR_DOUBLE: retval += sizeof (double); break;
            case EXR_ATTR_FLOAT: retval += sizeof (float); break;
            case EXR_ATTR_FLOAT_VECTOR:
                retval += sizeof (float) * (size_t) (cur->floatvector->length);
                break;
            case EXR_ATTR_INT: retval += sizeof (int32_t); break;
            case EXR_ATTR_KEYCODE: retval += sizeof (*(cur->keycode)); break;
            case EXR_ATTR_M33F: retval += sizeof (*(cur->m33f)); break;
            case EXR_ATTR_M33D: retval += sizeof (*(cur->m33d)); break;
            case EXR_ATTR_M44F: retval += sizeof (*(cur->m44f)); break;
            case EXR_ATTR_M44D: retval += sizeof (*(cur->m44d)); break;
            case EXR_ATTR_PREVIEW:
                retval += (size_t) cur->preview->width *
                          (size_t) cur->preview->height * (size_t) 4;
                break;
            case EXR_ATTR_RATIONAL: retval += sizeof (*(cur->rational)); break;
            case EXR_ATTR_STRING: retval += (size_t) cur->string->length; break;
            case EXR_ATTR_STRING_VECTOR:
                for (int s = 0; s < cur->stringvector->n_strings; ++s)
                {
                    retval += (size_t) cur->stringvector->strings[s].length;
                    retval += sizeof (int32_t);
                }
                break;
            case EXR_ATTR_TILEDESC: retval += sizeof (*(cur->tiledesc)); break;
            case EXR_ATTR_TIMECODE: retval += sizeof (*(cur->timecode)); break;
            case EXR_ATTR_V2I: retval += sizeof (*(cur->v2i)); break;
            case EXR_ATTR_V2F: retval += sizeof (*(cur->v2f)); break;
            case EXR_ATTR_V2D: retval += sizeof (*(cur->v2d)); break;
            case EXR_ATTR_V3I: retval += sizeof (*(cur->v3i)); break;
            case EXR_ATTR_V3F: retval += sizeof (*(cur->v3f)); break;
            case EXR_ATTR_V3D: retval += sizeof (*(cur->v3d)); break;
            case EXR_ATTR_DEEP_IMAGE_STATE: retval += sizeof (uint8_t); break;
            case EXR_ATTR_OPAQUE:
                if (cur->opaque->packed_data)
                    retval += (size_t) cur->opaque->size;
                else if (cur->opaque->unpacked_data)
                {
                    int32_t sz = 0;
                    rv =
                        exr_attr_opaquedata_pack (ctxt, cur->opaque, &sz, NULL);
                    if (rv != EXR_ERR_SUCCESS) return rv;

                    retval += (size_t) sz;
                }
                break;
            case EXR_ATTR_UNKNOWN:
            case EXR_ATTR_LAST_KNOWN_TYPE:
            default:
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Invalid / unhandled type '%s' for attribute '%s', unable to compute size",
                    cur->type_name,
                    cur->name);
        }
    }

    *out = retval;
    return rv;
}